

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

bool __thiscall
tinyusdz::Xformable::EvaluateXformOps
          (Xformable *this,double t,TimeSampleInterpolationType tinterp,matrix4d *out_matrix,
          bool *resetXformStack,string *err)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [12];
  undefined6 uVar6;
  undefined1 auVar7 [16];
  half hVar8;
  half hVar9;
  bool bVar10;
  long lVar11;
  value *pvVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  uint *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  mat<double,_4,_4> *a;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  undefined8 *puVar19;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar20;
  char *pcVar21;
  undefined8 uVar22;
  XformEvaluator *pXVar23;
  matrix4d *pmVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  value *pvVar26;
  string *args_1;
  byte bVar27;
  pointer pXVar28;
  byte bVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar38;
  undefined1 in_XMM2 [16];
  undefined1 auVar39 [16];
  uint uVar41;
  undefined1 in_XMM4 [16];
  undefined8 uVar43;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  XformEvaluator eval;
  optional<tinyusdz::value::quath> h;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  value_type x;
  undefined1 local_3b8 [16];
  double local_3a8;
  fmt local_398;
  undefined1 uStack_397;
  half hStack_396;
  half hStack_394;
  half hStack_392;
  uint16_t uStack_390;
  uint16_t uStack_38e;
  float fStack_38c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_388;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  double local_350;
  undefined1 auStack_348 [16];
  undefined1 auStack_338 [16];
  undefined1 auStack_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  fmt local_2e8;
  undefined1 uStack_2e7;
  quath qStack_2e6;
  undefined6 uStack_2de;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2b8 [7];
  bool local_248;
  undefined1 local_238 [32];
  undefined3 uStack_218;
  undefined8 local_215;
  undefined8 uStack_20d;
  undefined8 local_205;
  undefined8 uStack_1fd;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  storage_union local_1c0;
  vtable_type *local_1b0;
  bool local_1a8;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_1a0;
  bool local_188;
  bool local_180;
  bool *local_178;
  Xformable *local_170;
  ulong local_168;
  undefined1 local_160 [32];
  matrix4d *local_140;
  double local_138 [12];
  undefined1 local_d8 [16];
  double local_c8;
  undefined8 uStack_c0;
  matrix4d local_b8;
  uint uVar37;
  uint uVar40;
  
  bVar29 = 0;
  local_178 = resetXformStack;
  local_140 = out_matrix;
  local_170 = this;
  local_b8.m[3][2] = 0.0;
  local_b8.m[3][3] = 0.0;
  local_b8.m[3][0] = 0.0;
  local_b8.m[3][1] = 0.0;
  local_b8.m[2][2] = 0.0;
  local_b8.m[2][3] = 0.0;
  local_b8.m[2][0] = 0.0;
  local_b8.m[2][1] = 0.0;
  local_b8.m[1][2] = 0.0;
  local_b8.m[1][3] = 0.0;
  local_b8.m[1][0] = 0.0;
  local_b8.m[1][1] = 0.0;
  local_b8.m[0][2] = 0.0;
  local_b8.m[0][3] = 0.0;
  local_b8.m[0][0] = 0.0;
  local_b8.m[0][1] = 0.0;
  lVar11 = 0;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x3ff0000000000000;
  do {
    *(undefined8 *)((long)local_b8.m[0] + lVar11) = 0x3ff0000000000000;
    lVar11 = lVar11 + 0x28;
  } while (lVar11 != 0xa0);
  pXVar28 = (this->xformOps).
            super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->xformOps).super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
      _M_impl.super__Vector_impl_data._M_finish != pXVar28) {
    uVar17 = 0;
    args_1 = err;
    do {
      local_1e8[4] = pXVar28[uVar17].inverted;
      local_1e8._0_4_ = pXVar28[uVar17].op_type;
      local_1e0._M_dataplus._M_p = local_1e8 + 0x18;
      pcVar1 = pXVar28[uVar17].suffix._M_dataplus._M_p;
      local_168 = uVar17;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1e8 + 8),pcVar1,pcVar1 + pXVar28[uVar17].suffix._M_string_length);
      local_1b0 = pXVar28[uVar17]._var._value.v_.vtable;
      if (local_1b0 != (vtable_type *)0x0) {
        (*local_1b0->copy)((storage_union *)&pXVar28[uVar17]._var,
                           (storage_union *)(local_1e8 + 0x28));
      }
      local_1a8 = pXVar28[uVar17]._var._blocked;
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                *)(local_1e8 + 0x48),&pXVar28[uVar17]._var._ts._samples);
      local_188 = pXVar28[uVar17]._var._ts._dirty;
      local_180 = pXVar28[uVar17]._is_blocked;
      local_c8 = 0.0;
      uStack_c0 = 0;
      local_d8 = ZEXT816(0);
      local_138[10] = 0.0;
      local_138[0xb] = 0.0;
      local_138[8] = 0.0;
      local_138[9] = 0.0;
      local_138[6] = 0.0;
      local_138[7] = 0.0;
      local_138[4] = 0.0;
      local_138[5] = 0.0;
      local_138[2] = 0.0;
      local_138[3] = 0.0;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      lVar11 = 0;
      do {
        *(undefined8 *)((long)local_138 + lVar11) = 0x3ff0000000000000;
        lVar11 = lVar11 + 0x28;
      } while (lVar11 != 0xa0);
      args = &switchD_00237577::switchdataD_0024a188;
      pvVar26 = (value *)local_138;
      switch(local_1e8._0_4_) {
      case 0:
        XformOp::get_value<tinyusdz::value::matrix4f>
                  ((optional<tinyusdz::value::matrix4f> *)&local_398,(XformOp *)local_1e8,t,tinterp)
        ;
        uVar38 = uStack_368;
        if (local_398 == (fmt)0x1) {
          uVar6 = CONCAT24(uStack_390,CONCAT22(hStack_392.value,hStack_394.value));
          local_205 = CONCAT44(local_360,uStack_364);
          uStack_1fd = CONCAT44(uStack_358,uStack_35c);
          local_215 = CONCAT44(local_370,uStack_374);
          uStack_20d = CONCAT44(uStack_368,uStack_36c);
          local_238._19_5_ =
               (undefined5)CONCAT44(aStack_388._8_4_,aStack_388._M_allocated_capacity._4_4_);
          local_238._24_3_ = (undefined3)((uint)aStack_388._8_4_ >> 8);
          local_238._27_5_ = (undefined5)CONCAT44(uStack_378,aStack_388._12_4_);
          uStack_218 = (undefined3)((uint)uStack_378 >> 8);
          local_238._3_5_ = (undefined5)uVar6;
          local_238._8_3_ = (undefined3)(CONCAT26(uStack_38e,uVar6) >> 0x28);
          local_238._11_5_ = (undefined5)CONCAT44(aStack_388._M_allocated_capacity._0_4_,fStack_38c)
          ;
          local_238[0x10] = (undefined1)((uint)aStack_388._0_4_ >> 8);
          local_238._17_2_ = (undefined2)((uint)aStack_388._0_4_ >> 0x10);
          auVar7._8_5_ = local_238._27_5_;
          auVar7._0_8_ = CONCAT35(local_238._24_3_,local_238._19_5_);
          auVar7._13_3_ = uStack_218;
          in_XMM2._8_8_ = CONCAT44(uStack_368,uStack_36c);
          in_XMM2._0_8_ = (double)CONCAT44(local_370,uStack_374);
          uStack_368 = uStack_364;
          uStack_364 = local_360;
          local_360 = uStack_35c;
          uStack_35c = uStack_358;
          uStack_378 = uStack_374;
          uStack_374 = local_370;
          local_370 = uStack_36c;
          uStack_36c = uVar38;
          aStack_388._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._4_4_;
          aStack_388._M_allocated_capacity._4_4_ =
               (undefined4)(CONCAT35(local_238._24_3_,local_238._19_5_) >> 0x20);
          aStack_388._8_4_ = aStack_388._12_4_;
          aStack_388._12_4_ = auVar7._12_4_;
          local_398 = SUB21(hStack_394.value,0);
          uStack_397 = (undefined1)(hStack_394.value >> 8);
          hStack_396.value = hStack_392.value;
          hStack_394.value = (uint16_t)(CONCAT35(local_238._8_3_,local_238._3_5_) >> 0x20);
          hStack_392.value = uStack_38e;
          uStack_390 = SUB42(fStack_38c,0);
          uStack_38e = (uint16_t)((uint)fStack_38c >> 0x10);
          fStack_38c = (float)(CONCAT26(local_238._17_2_,CONCAT15(local_238[0x10],local_238._11_5_))
                              >> 0x20);
          lVar11 = 0;
          pvVar12 = (value *)local_138;
          args = (uint *)&local_398;
          do {
            lVar18 = 0;
            do {
              uVar22 = *(undefined8 *)((long)((((XformEvaluator *)args)->m).m + -1) + lVar18 * 4);
              dVar3 = (double)(float)((ulong)uVar22 >> 0x20);
              auVar2._8_4_ = SUB84(dVar3,0);
              auVar2._0_8_ = (double)(float)uVar22;
              auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
              *(undefined1 (*) [16])(pvVar12 + lVar18 * 8) = auVar2;
              lVar18 = lVar18 + 2;
            } while (lVar18 != 4);
            lVar11 = lVar11 + 1;
            args = (uint *)&(((XformEvaluator *)args)->err).field_2;
            pvVar12 = pvVar12 + 0x20;
          } while (lVar11 != 4);
        }
        else {
          XformOp::get_value<tinyusdz::value::matrix4d>
                    ((optional<tinyusdz::value::matrix4d> *)&local_398,(XformOp *)local_1e8,t,
                     tinterp);
          if (local_398 == (fmt)0x0) {
joined_r0x00238727:
            if (err != (string *)0x0) goto LAB_00238a38;
            goto LAB_00238a3d;
          }
          memcpy(local_2c8 + 7,&uStack_390,0x80);
          memcpy((value *)local_138,local_2c8 + 7,0x80);
        }
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)args;
        if ((bool)local_1e8[4] != false) {
          pvVar12 = (value *)local_138;
          pXVar23 = (XformEvaluator *)&local_398;
          for (args = (uint *)0x10;
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              args = (uint *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)args + -0x20))->field_2 + 0xf)) {
            (pXVar23->err)._M_dataplus._M_p = *(pointer *)pvVar12;
            pvVar12 = pvVar12 + (ulong)bVar29 * -0x10 + 8;
            pXVar23 = (XformEvaluator *)((long)pXVar23 + (ulong)bVar29 * -0x10 + 8);
          }
          dVar3 = linalg::determinant<double>((mat<double,_4,_4> *)&local_398);
          if (ABS(dVar3) < 1e-09) {
            if (err != (string *)0x0) {
              if (local_1e0._M_string_length != 0) {
                pcVar21 = "`xformOp:transform:{}` is singular matrix and cannot be inverted.\n";
                pcVar16 = "";
                goto LAB_002387de;
              }
              goto LAB_00238a38;
            }
            goto LAB_00238a3d;
          }
          pvVar12 = (value *)local_138;
          pXVar23 = (XformEvaluator *)&local_398;
          for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pXVar23->err)._M_dataplus._M_p = *(pointer *)pvVar12;
            pvVar12 = pvVar12 + (ulong)bVar29 * -0x10 + 8;
            pXVar23 = (XformEvaluator *)((long)pXVar23 + (ulong)bVar29 * -0x10 + 8);
          }
          pXVar23 = (XformEvaluator *)local_2c8;
          linalg::inverse<double,4>((mat<double,_4,_4> *)pXVar23,(linalg *)&local_398,a);
          lVar11 = 0x10;
          goto LAB_002389f5;
        }
        break;
      case 1:
        XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_398,
                   (XformOp *)local_1e8,t,tinterp);
        hVar9.value = hStack_392.value;
        hVar8.value = hStack_394.value;
        if (local_398 == (fmt)0x1) {
          fVar30 = tinyusdz::value::half_to_float(hStack_396);
          fVar31 = tinyusdz::value::half_to_float(hVar8);
          local_3b8._8_4_ = SUB84((double)fVar31,0);
          local_3b8._0_8_ = (double)fVar30;
          local_3b8._12_4_ = (int)((ulong)(double)fVar31 >> 0x20);
          fVar30 = tinyusdz::value::half_to_float(hVar9);
          local_c8 = (double)fVar30;
        }
        else {
          XformOp::get_value<std::array<float,3ul>>
                    ((optional<std::array<float,_3UL>_> *)&local_398,(XformOp *)local_1e8,t,tinterp)
          ;
          if (local_398 == (fmt)0x1) {
            dVar3 = (double)(float)(CONCAT26(uStack_38e,
                                             CONCAT24(uStack_390,
                                                      CONCAT22(hStack_392.value,hStack_394.value)))
                                   >> 0x20);
            local_3b8._8_4_ = SUB84(dVar3,0);
            local_3b8._0_8_ = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
            local_3b8._12_4_ = (int)((ulong)dVar3 >> 0x20);
            local_c8 = (double)fStack_38c;
          }
          else {
            XformOp::get_value<std::array<double,3ul>>
                      ((optional<std::array<double,_3UL>_> *)&local_398,(XformOp *)local_1e8,t,
                       tinterp);
            if (local_398 != (fmt)0x1) goto joined_r0x00238727;
            local_3b8._2_2_ = uStack_38e;
            local_3b8._0_2_ = uStack_390;
            local_3b8._4_4_ = fStack_38c;
            local_3b8._12_4_ = aStack_388._M_allocated_capacity._4_4_;
            local_3b8._8_4_ = aStack_388._M_allocated_capacity._0_4_;
            local_c8 = (double)CONCAT44(aStack_388._12_4_,aStack_388._8_4_);
          }
        }
        if ((char)local_1e8._4_4_ != '\0') {
          local_c8 = (double)CONCAT44((uint)((ulong)local_c8 >> 0x20) ^ DAT_00242750._4_4_,
                                      SUB84(local_c8,0) ^ (uint)DAT_00242750);
        }
        auVar36._0_4_ = (int)(local_1e8._4_4_ << 0x1f) >> 0x1f;
        auVar36._4_4_ = (int)(local_1e8._4_4_ << 0x1f) >> 0x1f;
        auVar36._8_4_ = (int)(local_1e8._4_4_ << 0x1f) >> 0x1f;
        auVar36._12_4_ = (int)(local_1e8._4_4_ << 0x1f) >> 0x1f;
        in_XMM2 = ~auVar36 & local_3b8;
        in_XMM4 = (local_3b8 ^ _DAT_00242750) & auVar36 | in_XMM2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)args;
        local_d8 = in_XMM4;
        break;
      case 2:
        XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_398,
                   (XformOp *)local_1e8,t,tinterp);
        hVar9.value = hStack_392.value;
        hVar8.value = hStack_394.value;
        if (local_398 == (fmt)0x1) {
          fVar30 = tinyusdz::value::half_to_float(hStack_396);
          local_3b8._0_8_ = (double)fVar30;
          fVar30 = tinyusdz::value::half_to_float(hVar8);
          fVar31 = tinyusdz::value::half_to_float(hVar9);
          dVar3 = (double)fVar30;
          local_138[10] = (double)fVar31;
        }
        else {
          XformOp::get_value<std::array<float,3ul>>
                    ((optional<std::array<float,_3UL>_> *)&local_398,(XformOp *)local_1e8,t,tinterp)
          ;
          if (local_398 == (fmt)0x1) {
            local_3b8._0_8_ = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
            dVar3 = (double)(float)CONCAT22(uStack_38e,uStack_390);
            local_138[10] = (double)fStack_38c;
          }
          else {
            XformOp::get_value<std::array<double,3ul>>
                      ((optional<std::array<double,_3UL>_> *)&local_398,(XformOp *)local_1e8,t,
                       tinterp);
            if (local_398 != (fmt)0x1) goto joined_r0x00238727;
            local_3b8._2_2_ = uStack_38e;
            local_3b8._0_2_ = uStack_390;
            local_3b8._4_4_ = fStack_38c;
            dVar3 = (double)CONCAT44(aStack_388._M_allocated_capacity._4_4_,
                                     aStack_388._M_allocated_capacity._0_4_);
            local_138[10] = (double)CONCAT44(aStack_388._12_4_,aStack_388._8_4_);
          }
        }
        if ((bool)local_1e8[4] == false) {
          in_XMM2._8_8_ = local_138[10];
          in_XMM2._0_8_ = dVar3;
          local_138[0] = (double)local_3b8._0_8_;
        }
        else {
          local_138[0] = 1.0 / (double)local_3b8._0_8_;
          in_XMM2._0_8_ = 1.0 / dVar3;
          in_XMM2._8_8_ = 0;
          local_138[10] = 1.0 / local_138[10];
        }
        in_XMM4._8_8_ = 0;
        in_XMM4._0_8_ = local_138[0];
        local_138[5] = in_XMM2._0_8_;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)args;
        break;
      case 3:
        XformOp::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_398,(XformOp *)local_1e8,t,tinterp);
        if (local_398 == (fmt)0x1) {
          fVar30 = tinyusdz::value::half_to_float(hStack_396);
          dVar3 = (double)fVar30;
        }
        else {
          XformOp::get_value<float>((optional<float> *)&local_398,(XformOp *)local_1e8,t,tinterp);
          if (local_398 == (fmt)0x1) {
            dVar3 = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
          }
          else {
            XformOp::get_value<double>
                      ((optional<double> *)&local_398,(XformOp *)local_1e8,t,tinterp);
            if (local_398 != (fmt)0x1) {
              if (err == (string *)0x0) goto LAB_00238a3d;
              if (local_1e0._M_string_length == 0) goto LAB_00238a38;
              pcVar21 = "`xformOp:rotateX:{}` is not half, float or double type.\n";
              pcVar16 = "";
LAB_002387de:
              local_2c8._0_8_ = aaStack_2b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,pcVar21,pcVar16);
              fmt::format<std::__cxx11::string>
                        ((string *)&local_398,(fmt *)local_2c8,(string *)(local_1e8 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              std::__cxx11::string::_M_append
                        ((char *)err,
                         CONCAT26(hStack_392.value,
                                  CONCAT24(hStack_394.value,
                                           CONCAT22(hStack_396.value,CONCAT11(uStack_397,local_398))
                                          )));
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT26(hStack_392.value,
                                    CONCAT24(hStack_394.value,
                                             CONCAT22(hStack_396.value,
                                                      CONCAT11(uStack_397,local_398))));
              if (paVar14 != &aStack_388) {
                operator_delete(paVar14,CONCAT44(aStack_388._M_allocated_capacity._4_4_,
                                                 aStack_388._M_allocated_capacity._0_4_) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._0_8_ != aaStack_2b8) {
                uVar22 = aaStack_2b8[0]._M_allocated_capacity;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2c8._0_8_;
LAB_00238845:
                operator_delete(paVar14,uVar22 + 1);
              }
              goto LAB_00238a3d;
            }
            dVar3 = (double)CONCAT44(fStack_38c,CONCAT22(uStack_38e,uStack_390));
          }
        }
        paVar14 = &aStack_388;
        local_398 = SUB81(paVar14,0);
        uStack_397 = (undefined1)((ulong)paVar14 >> 8);
        hStack_396.value = (uint16_t)((ulong)paVar14 >> 0x10);
        hStack_394.value = (uint16_t)((ulong)paVar14 >> 0x20);
        hStack_392.value = (uint16_t)((ulong)paVar14 >> 0x30);
        uStack_390 = 0;
        uStack_38e = 0;
        fStack_38c = 0.0;
        aStack_388._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        auStack_348 = ZEXT816(0);
        uStack_378 = 0;
        uStack_374 = 0;
        local_350 = 0.0;
        local_360 = 0;
        uStack_35c = 0;
        local_370 = 0;
        uStack_36c = 0;
        lVar11 = 0x20;
        uStack_368 = uStack_378;
        uStack_364 = uStack_374;
        uStack_358 = uStack_378;
        uStack_354 = uStack_374;
        auStack_338 = auStack_348;
        auStack_328 = auStack_348;
        local_318 = auStack_348;
        local_308 = auStack_348;
        do {
          *(undefined8 *)(&local_398 + lVar11) = 0x3ff0000000000000;
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != 0xc0);
        anon_unknown_4::XformEvaluator::RotateX((XformEvaluator *)&local_398,dVar3);
        goto LAB_00238484;
      case 4:
        XformOp::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_398,(XformOp *)local_1e8,t,tinterp);
        if (local_398 == (fmt)0x1) {
          fVar30 = tinyusdz::value::half_to_float(hStack_396);
          dVar3 = (double)fVar30;
        }
        else {
          XformOp::get_value<float>((optional<float> *)&local_398,(XformOp *)local_1e8,t,tinterp);
          if (local_398 == (fmt)0x1) {
            dVar3 = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
          }
          else {
            XformOp::get_value<double>
                      ((optional<double> *)&local_398,(XformOp *)local_1e8,t,tinterp);
            if (local_398 != (fmt)0x1) {
              if (err != (string *)0x0) {
                if (local_1e0._M_string_length != 0) {
                  pcVar21 = "`xformOp:rotateY:{}` is not half, float or double type.\n";
                  pcVar16 = "";
                  goto LAB_002387de;
                }
                goto LAB_00238a38;
              }
              goto LAB_00238a3d;
            }
            dVar3 = (double)CONCAT44(fStack_38c,CONCAT22(uStack_38e,uStack_390));
          }
        }
        paVar14 = &aStack_388;
        local_398 = SUB81(paVar14,0);
        uStack_397 = (undefined1)((ulong)paVar14 >> 8);
        hStack_396.value = (uint16_t)((ulong)paVar14 >> 0x10);
        hStack_394.value = (uint16_t)((ulong)paVar14 >> 0x20);
        hStack_392.value = (uint16_t)((ulong)paVar14 >> 0x30);
        uStack_390 = 0;
        uStack_38e = 0;
        fStack_38c = 0.0;
        aStack_388._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        auStack_348 = ZEXT816(0);
        uStack_378 = 0;
        uStack_374 = 0;
        local_350 = 0.0;
        local_360 = 0;
        uStack_35c = 0;
        local_370 = 0;
        uStack_36c = 0;
        lVar11 = 0x20;
        uStack_368 = uStack_378;
        uStack_364 = uStack_374;
        uStack_358 = uStack_378;
        uStack_354 = uStack_374;
        auStack_338 = auStack_348;
        auStack_328 = auStack_348;
        local_318 = auStack_348;
        local_308 = auStack_348;
        do {
          *(undefined8 *)(&local_398 + lVar11) = 0x3ff0000000000000;
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != 0xc0);
        anon_unknown_4::XformEvaluator::RotateY((XformEvaluator *)&local_398,dVar3);
        goto LAB_00238484;
      case 5:
        XformOp::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_398,(XformOp *)local_1e8,t,tinterp);
        if (local_398 == (fmt)0x1) {
          fVar30 = tinyusdz::value::half_to_float(hStack_396);
          dVar3 = (double)fVar30;
        }
        else {
          XformOp::get_value<float>((optional<float> *)&local_398,(XformOp *)local_1e8,t,tinterp);
          if (local_398 == (fmt)0x1) {
            dVar3 = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
          }
          else {
            XformOp::get_value<double>
                      ((optional<double> *)&local_398,(XformOp *)local_1e8,t,tinterp);
            if (local_398 != (fmt)0x1) {
              if (err != (string *)0x0) {
                if (local_1e0._M_string_length != 0) {
                  pcVar21 = "`xformOp:rotateZ:{}` is not half, float or double type.\n";
                  pcVar16 = "";
                  goto LAB_002387de;
                }
                goto LAB_00238a38;
              }
              goto LAB_00238a3d;
            }
            dVar3 = (double)CONCAT44(fStack_38c,CONCAT22(uStack_38e,uStack_390));
          }
        }
        paVar14 = &aStack_388;
        local_398 = SUB81(paVar14,0);
        uStack_397 = (undefined1)((ulong)paVar14 >> 8);
        hStack_396.value = (uint16_t)((ulong)paVar14 >> 0x10);
        hStack_394.value = (uint16_t)((ulong)paVar14 >> 0x20);
        hStack_392.value = (uint16_t)((ulong)paVar14 >> 0x30);
        uStack_390 = 0;
        uStack_38e = 0;
        fStack_38c = 0.0;
        aStack_388._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        auStack_348 = ZEXT816(0);
        uStack_378 = 0;
        uStack_374 = 0;
        local_350 = 0.0;
        local_360 = 0;
        uStack_35c = 0;
        local_370 = 0;
        uStack_36c = 0;
        lVar11 = 0x20;
        uStack_368 = uStack_378;
        uStack_364 = uStack_374;
        uStack_358 = uStack_378;
        uStack_354 = uStack_374;
        auStack_338 = auStack_348;
        auStack_328 = auStack_348;
        local_318 = auStack_348;
        local_308 = auStack_348;
        do {
          *(undefined8 *)(&local_398 + lVar11) = 0x3ff0000000000000;
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != 0xc0);
        anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)&local_398,dVar3);
LAB_00238484:
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2c8,(XformEvaluator *)&local_398);
        bVar27 = local_248;
        if (local_248 == true) {
          peVar20 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_2c8;
          for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(double *)pvVar26 =
                 (peVar20->contained).
                 super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0.m_value.m[0][0];
            peVar20 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)peVar20 + (ulong)bVar29 * -0x10 + 8);
            pvVar26 = pvVar26 + (ulong)bVar29 * -0x10 + 8;
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        else if (err != (string *)0x0) {
          std::__cxx11::string::_M_append((char *)err,local_2c8._0_8_);
        }
        if (((local_248 & 1U) == 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._0_8_ != aaStack_2b8)) {
          operator_delete((void *)local_2c8._0_8_,aaStack_2b8[0]._M_allocated_capacity + 1);
        }
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT26(hStack_392.value,
                              CONCAT24(hStack_394.value,
                                       CONCAT22(hStack_396.value,CONCAT11(uStack_397,local_398))));
        if (paVar25 != &aStack_388) {
          uVar22 = CONCAT44(aStack_388._M_allocated_capacity._4_4_,
                            aStack_388._M_allocated_capacity._0_4_);
LAB_0023851f:
          operator_delete(paVar25,uVar22 + 1);
        }
LAB_00238527:
        if (bVar27 != 0) break;
LAB_00238a3d:
        bVar10 = false;
        goto LAB_00238a40;
      case 6:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
        XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_398,
                   (XformOp *)local_1e8,t,tinterp);
        hVar9.value = hStack_392.value;
        hVar8.value = hStack_394.value;
        uVar43 = in_XMM4._8_8_;
        uVar22 = in_XMM2._8_8_;
        if (local_398 != (fmt)0x1) {
          XformOp::get_value<std::array<float,3ul>>
                    ((optional<std::array<float,_3UL>_> *)&local_398,(XformOp *)local_1e8,t,tinterp)
          ;
          uVar43 = in_XMM4._8_8_;
          if (local_398 == (fmt)0x1) {
            auVar34._0_8_ = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
            auVar34._8_8_ =
                 (double)(float)(CONCAT26(uStack_38e,
                                          CONCAT24(uStack_390,
                                                   CONCAT22(hStack_392.value,hStack_394.value))) >>
                                0x20);
            in_XMM2._0_8_ = (double)fStack_38c;
            goto LAB_00237638;
          }
          XformOp::get_value<std::array<double,3ul>>
                    ((optional<std::array<double,_3UL>_> *)&local_398,(XformOp *)local_1e8,t,tinterp
                    );
          uVar43 = in_XMM4._8_8_;
          if (local_398 != (fmt)0x0) {
            auVar34._2_2_ = uStack_38e;
            auVar34._0_2_ = uStack_390;
            auVar34._4_4_ = fStack_38c;
            auVar34._8_4_ = aStack_388._M_allocated_capacity._0_4_;
            auVar34._12_4_ = aStack_388._M_allocated_capacity._4_4_;
            in_XMM2._4_4_ = aStack_388._12_4_;
            in_XMM2._0_4_ = aStack_388._8_4_;
            in_XMM2._8_8_ = 0;
            goto LAB_00237638;
          }
          if (local_1e0._M_string_length == 0) {
            local_2e8 = SUB81(&local_2d8,0);
            uStack_2e7 = (undefined1)((ulong)&local_2d8 >> 8);
            qStack_2e6.imag._M_elems = SUB86((ulong)&local_2d8 >> 0x10,0);
            local_160._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b;
            auVar44 = std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)local_160);
            local_2e8 = auVar44[0];
            uStack_2e7 = auVar44[1];
            qStack_2e6.imag._M_elems = auVar44._2_6_;
            local_2d8._M_allocated_capacity = local_160._0_8_;
            builtin_strncpy(auVar44._0_8_,"`{}` is not half3, float3 or double3 type.\n",0x2b);
            qStack_2e6.real.value = (uint16_t)local_160._0_8_;
            uStack_2de = SUB86(local_160._0_8_,2);
            auVar44._0_8_[local_160._0_8_] = '\0';
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_160._0_8_;
            tinyusdz::to_string_abi_cxx11_((string *)local_160,(tinyusdz *)local_1e8,auVar44._8_8_);
            fmt::format<std::__cxx11::string>
                      ((string *)local_238,&local_2e8,(string *)local_160,pbVar15);
            _Var13._M_p = (pointer)CONCAT53(local_238._3_5_,local_238._0_3_);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_238 + 0x10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var13._M_p == paVar25) {
              _Var13._M_p = (pointer)&aStack_388;
              aStack_388._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_238._19_5_,CONCAT21(local_238._17_2_,local_238[0x10]))
              ;
              aStack_388._8_4_ = (undefined4)CONCAT53(local_238._27_5_,local_238._24_3_);
              aStack_388._12_4_ = SUB54(local_238._27_5_,1);
            }
            else {
              aStack_388._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_238._19_5_,CONCAT21(local_238._17_2_,local_238[0x10]))
              ;
            }
            aStack_388._M_allocated_capacity._4_4_ = SUB54(local_238._19_5_,1);
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT53(local_238._11_5_,local_238._8_3_);
            local_238._0_3_ = SUB83(paVar25,0);
            local_238._3_5_ = (undefined5)((ulong)paVar25 >> 0x18);
            local_238._8_3_ = 0;
            local_238._11_5_ = 0;
            local_238[0x10] = '\0';
            local_248 = false;
            local_2c8._0_8_ = aaStack_2b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var13._M_p == &aStack_388) {
              aaStack_2b8[0]._8_8_ = CONCAT44(aStack_388._12_4_,aStack_388._8_4_);
            }
            else {
              local_2c8._0_8_ = _Var13._M_p;
            }
            aaStack_2b8[0]._M_allocated_capacity._4_4_ = aStack_388._M_allocated_capacity._4_4_;
            aaStack_2b8[0]._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._0_4_;
            local_2c8._8_8_ = paVar14;
            local_398 = SUB81(&aStack_388,0);
            uStack_397 = (undefined1)((ulong)&aStack_388 >> 8);
            hStack_396.value = (uint16_t)((ulong)&aStack_388 >> 0x10);
            hStack_394.value = (uint16_t)((ulong)&aStack_388 >> 0x20);
            hStack_392.value = (uint16_t)((ulong)&aStack_388 >> 0x30);
          }
          else {
            local_2e8 = SUB81(&local_2d8,0);
            uStack_2e7 = (undefined1)((ulong)&local_2d8 >> 8);
            qStack_2e6.imag._M_elems = SUB86((ulong)&local_2d8 >> 0x10,0);
            local_160._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e;
            auVar44 = std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)local_160);
            local_2e8 = auVar44[0];
            uStack_2e7 = auVar44[1];
            qStack_2e6.imag._M_elems = auVar44._2_6_;
            local_2d8._M_allocated_capacity = local_160._0_8_;
            builtin_strncpy(auVar44._0_8_,"`{}:{}` is not half3, float3 or double3 type.\n",0x2e);
            qStack_2e6.real.value = (uint16_t)local_160._0_8_;
            uStack_2de = SUB86(local_160._0_8_,2);
            auVar44._0_8_[local_160._0_8_] = '\0';
            tinyusdz::to_string_abi_cxx11_((string *)local_160,(tinyusdz *)local_1e8,auVar44._8_8_);
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_238,&local_2e8,(string *)local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_1e8 + 8),args_1);
            _Var13._M_p = (pointer)CONCAT53(local_238._3_5_,local_238._0_3_);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_238 + 0x10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var13._M_p == paVar25) {
              _Var13._M_p = (pointer)&aStack_388;
              aStack_388._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_238._19_5_,CONCAT21(local_238._17_2_,local_238[0x10]))
              ;
              aStack_388._8_4_ = (undefined4)CONCAT53(local_238._27_5_,local_238._24_3_);
              aStack_388._12_4_ = SUB54(local_238._27_5_,1);
            }
            else {
              aStack_388._M_allocated_capacity._0_4_ =
                   (undefined4)CONCAT53(local_238._19_5_,CONCAT21(local_238._17_2_,local_238[0x10]))
              ;
            }
            aStack_388._M_allocated_capacity._4_4_ = SUB54(local_238._19_5_,1);
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT53(local_238._11_5_,local_238._8_3_);
            local_238._0_3_ = SUB83(paVar25,0);
            local_238._3_5_ = (undefined5)((ulong)paVar25 >> 0x18);
            local_238._8_3_ = 0;
            local_238._11_5_ = 0;
            local_238[0x10] = '\0';
            local_248 = false;
            local_2c8._0_8_ = aaStack_2b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var13._M_p == &aStack_388) {
              aaStack_2b8[0]._8_8_ = CONCAT44(aStack_388._12_4_,aStack_388._8_4_);
            }
            else {
              local_2c8._0_8_ = _Var13._M_p;
            }
            aaStack_2b8[0]._M_allocated_capacity._4_4_ = aStack_388._M_allocated_capacity._4_4_;
            aaStack_2b8[0]._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._0_4_;
            local_2c8._8_8_ = paVar14;
            local_398 = SUB81(&aStack_388,0);
            uStack_397 = (undefined1)((ulong)&aStack_388 >> 8);
            hStack_396.value = (uint16_t)((ulong)&aStack_388 >> 0x10);
            hStack_394.value = (uint16_t)((ulong)&aStack_388 >> 0x20);
            hStack_392.value = (uint16_t)((ulong)&aStack_388 >> 0x30);
          }
          local_238[0x10] = '\0';
          local_238._11_5_ = 0;
          local_238._8_3_ = 0;
          local_248 = false;
          uStack_390 = 0;
          uStack_38e = 0;
          fStack_38c = 0.0;
          aStack_388._M_allocated_capacity._0_4_ =
               aStack_388._M_allocated_capacity._0_4_ & 0xffffff00;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_160 + 0x10)) {
            operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
          }
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT62(qStack_2e6.imag._M_elems,CONCAT11(uStack_2e7,local_2e8));
          uVar22 = local_2d8._M_allocated_capacity;
          if (paVar25 != &local_2d8) goto LAB_00237ea7;
          goto LAB_00237eaf;
        }
        fVar30 = tinyusdz::value::half_to_float(hStack_396);
        fVar31 = tinyusdz::value::half_to_float(hVar8);
        auVar34._8_4_ = SUB84((double)fVar31,0);
        auVar34._0_8_ = (double)fVar30;
        auVar34._12_4_ = (int)((ulong)(double)fVar31 >> 0x20);
        fVar30 = tinyusdz::value::half_to_float(hVar9);
        in_XMM2._0_8_ = (double)fVar30;
        in_XMM2._8_8_ = uVar22;
        local_3b8 = auVar34;
LAB_00237638:
        bVar10 = (bool)local_1e8[4];
        uVar37 = auVar34._4_4_;
        auVar5._4_8_ = uVar43;
        auVar5._0_4_ = uVar37;
        auVar42._0_8_ = auVar5._0_8_ << 0x20;
        auVar35._8_4_ = auVar34._8_4_;
        auVar42._8_4_ = auVar35._8_4_;
        uVar32 = auVar34._12_4_;
        auVar42._12_4_ = uVar32;
        uVar17 = auVar34._8_8_;
        in_XMM4._8_8_ = uVar17;
        in_XMM4._0_8_ = auVar42._8_8_;
        uVar41 = uVar32 ^ 0x80000000;
        local_398 = SUB81(&aStack_388,0);
        uStack_397 = (undefined1)((ulong)&aStack_388 >> 8);
        hStack_396.value = (uint16_t)((ulong)&aStack_388 >> 0x10);
        hStack_394.value = (uint16_t)((ulong)&aStack_388 >> 0x20);
        hStack_392.value = (uint16_t)((ulong)&aStack_388 >> 0x30);
        uStack_390 = 0;
        uStack_38e = 0;
        fStack_38c = 0.0;
        aStack_388._M_allocated_capacity._0_4_ = aStack_388._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        local_308 = ZEXT816(0);
        local_318 = ZEXT816(0);
        auStack_328 = ZEXT816(0);
        auStack_338 = ZEXT816(0);
        auStack_348 = ZEXT816(0);
        uStack_358 = 0;
        uStack_354 = 0;
        local_350 = 0.0;
        uStack_368 = 0;
        uStack_364 = 0;
        local_360 = 0;
        uStack_35c = 0;
        uStack_378 = 0;
        uStack_374 = 0;
        local_370 = 0;
        uStack_36c = 0;
        lVar11 = 0x20;
        do {
          *(undefined8 *)(&local_398 + lVar11) = 0x3ff0000000000000;
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != 0xc0);
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)(local_1e8._0_4_ - RotateXYZ);
        uVar38 = in_XMM2._0_4_;
        uVar40 = in_XMM2._4_4_;
        if (bVar10 != false) {
          if (5 < local_1e8._0_4_ - RotateXYZ) goto switchD_0023770b_default;
          uVar40 = uVar40 ^ 0x80000000;
          auVar39._0_8_ = in_XMM2._0_8_ ^ 0x8000000000000000;
          auVar39._8_4_ = in_XMM2._8_4_;
          auVar39._12_4_ = in_XMM2._12_4_ ^ 0x80000000;
          uVar37 = uVar37 ^ 0x80000000;
          auVar35._0_8_ = auVar34._0_8_ ^ 0x8000000000000000;
          auVar35._12_4_ = uVar32 ^ 0x80000000;
          in_XMM2 = auVar39;
          switch(paVar14) {
          case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0:
            local_2f8._0_8_ = uVar17 ^ 0x8000000000000000;
            local_2f8._8_4_ = auVar35._8_4_;
            local_2f8._12_4_ = uVar41;
            local_3b8 = auVar35;
            goto LAB_00237e61;
          case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1:
            uVar32 = uVar32 ^ 0x80000000;
            auVar34 = auVar35;
            goto LAB_00237dbf;
          case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2:
            local_2f8._0_8_ = uVar17 ^ 0x8000000000000000;
            local_2f8._8_4_ = auVar35._8_4_;
            local_2f8._12_4_ = uVar41;
            local_3b8 = auVar35;
            goto LAB_00237d5e;
          case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3:
            local_2f8._0_8_ = uVar17 ^ 0x8000000000000000;
            local_2f8._8_4_ = auVar35._8_4_;
            local_2f8._12_4_ = uVar41;
            goto LAB_00237df3;
          case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4:
            uVar32 = uVar32 ^ 0x80000000;
            auVar34 = auVar35;
            goto LAB_00237d7b;
          case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x5:
            local_2f8._0_8_ = uVar17 ^ 0x8000000000000000;
            local_2f8._8_4_ = auVar35._8_4_;
            local_2f8._12_4_ = uVar41;
          }
LAB_00237e2a:
          local_3a8 = in_XMM2._0_8_;
          anon_unknown_4::XformEvaluator::RotateX
                    ((XformEvaluator *)&local_398,(double)CONCAT44(uVar37,auVar34._0_4_));
          anon_unknown_4::XformEvaluator::RotateY
                    ((XformEvaluator *)&local_398,(double)local_2f8._0_8_);
LAB_00237e3f:
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)&local_398,local_3a8);
          goto LAB_00237e83;
        }
        switch(paVar14) {
        case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0:
          local_2f8 = in_XMM4;
          goto LAB_00237e2a;
        case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1:
          local_2f8 = in_XMM4;
LAB_00237df3:
          auVar44 = in_XMM2;
          anon_unknown_4::XformEvaluator::RotateX
                    ((XformEvaluator *)&local_398,(double)CONCAT44(uVar37,auVar34._0_4_));
          local_3a8 = in_XMM2._0_8_;
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)&local_398,local_3a8);
          in_XMM2 = auVar44;
          break;
        case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2:
LAB_00237d7b:
          local_3a8 = in_XMM2._0_8_;
          anon_unknown_4::XformEvaluator::RotateY
                    ((XformEvaluator *)&local_398,(double)CONCAT44(uVar32,auVar35._8_4_));
          local_3b8._0_8_ = auVar34._0_8_;
          anon_unknown_4::XformEvaluator::RotateX
                    ((XformEvaluator *)&local_398,(double)local_3b8._0_8_);
          local_3b8 = auVar34;
          goto LAB_00237e3f;
        case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3:
LAB_00237dbf:
          auVar44 = in_XMM2;
          anon_unknown_4::XformEvaluator::RotateY
                    ((XformEvaluator *)&local_398,(double)CONCAT44(uVar32,auVar35._8_4_));
          local_3a8 = in_XMM2._0_8_;
          anon_unknown_4::XformEvaluator::RotateZ((XformEvaluator *)&local_398,local_3a8);
          in_XMM2 = auVar44;
          local_3b8 = auVar34;
          goto LAB_00237e76;
        case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x4:
          local_3b8 = auVar34;
          local_2f8 = in_XMM4;
LAB_00237d5e:
          anon_unknown_4::XformEvaluator::RotateZ
                    ((XformEvaluator *)&local_398,(double)CONCAT44(uVar40,uVar38));
          anon_unknown_4::XformEvaluator::RotateX
                    ((XformEvaluator *)&local_398,(double)local_3b8._0_8_);
          break;
        case (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5:
          local_3b8 = auVar34;
          local_2f8 = in_XMM4;
LAB_00237e61:
          anon_unknown_4::XformEvaluator::RotateZ
                    ((XformEvaluator *)&local_398,(double)CONCAT44(uVar40,uVar38));
          anon_unknown_4::XformEvaluator::RotateY
                    ((XformEvaluator *)&local_398,(double)local_2f8._0_8_);
LAB_00237e76:
          anon_unknown_4::XformEvaluator::RotateX
                    ((XformEvaluator *)&local_398,(double)local_3b8._0_8_);
          goto LAB_00237e83;
        default:
switchD_0023770b_default:
          local_248 = false;
          std::__cxx11::string::string
                    ((string *)local_238,"[InternalError] RotateABC",(allocator *)&local_2e8);
          local_2c8._0_8_ = aaStack_2b8;
          _Var13._M_p._3_5_ = local_238._3_5_;
          _Var13._M_p._0_3_ = local_238._0_3_;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_238 + 0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p == paVar14) {
            aaStack_2b8[0]._8_8_ = CONCAT53(local_238._27_5_,local_238._24_3_);
          }
          else {
            local_2c8._0_8_ = _Var13._M_p;
          }
          aaStack_2b8[0]._1_2_ = local_238._17_2_;
          aaStack_2b8[0]._M_local_buf[0] = local_238[0x10];
          aaStack_2b8[0]._3_5_ = local_238._19_5_;
          local_2c8._11_5_ = local_238._11_5_;
          local_2c8._8_3_ = local_238._8_3_;
          goto LAB_00237e93;
        }
        anon_unknown_4::XformEvaluator::RotateY
                  ((XformEvaluator *)&local_398,(double)local_2f8._0_8_);
LAB_00237e83:
        (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
                  ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2c8,(XformEvaluator *)&local_398);
LAB_00237e93:
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT26(hStack_392.value,
                              CONCAT24(hStack_394.value,
                                       CONCAT22(hStack_396.value,CONCAT11(uStack_397,local_398))));
        if (paVar25 != &aStack_388) {
          uVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(aStack_388._M_allocated_capacity._4_4_,
                            aStack_388._M_allocated_capacity._0_4_);
LAB_00237ea7:
          operator_delete(paVar25,(ulong)((long)&(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar22)->_M_dataplus)._M_p + 1));
        }
LAB_00237eaf:
        bVar27 = local_248;
        if (local_248 == false) {
          std::__cxx11::string::_M_append((char *)err,local_2c8._0_8_);
        }
        else {
          puVar19 = (undefined8 *)local_2c8;
          for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(undefined8 *)pvVar26 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar29 * -2 + 1;
            pvVar26 = pvVar26 + (ulong)bVar29 * -0x10 + 8;
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        if (((local_248 & 1U) == 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._0_8_ != aaStack_2b8)) {
          uVar22 = aaStack_2b8[0]._M_allocated_capacity;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._0_8_;
          goto LAB_0023851f;
        }
        goto LAB_00238527;
      case 0xc:
        local_2c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3ff0000000000000;
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        aaStack_2b8[0]._8_8_ = 0.0;
        register0x00001240 = ZEXT816(0);
        aaStack_2b8[1]._M_allocated_capacity = 1.0;
        aaStack_2b8[2]._8_8_ = 0.0;
        aaStack_2b8[3]._0_8_ = 1.0;
        aaStack_2b8._24_16_ = register0x00001240;
        XformOp::get_value<tinyusdz::value::quath>
                  ((optional<tinyusdz::value::quath> *)&local_398,(XformOp *)local_1e8,t,tinterp);
        local_2e8 = local_398;
        if (local_398 == (fmt)0x1) {
          qStack_2e6.imag._M_elems[1].value = hStack_394.value;
          qStack_2e6.imag._M_elems[0].value = hStack_396.value;
          qStack_2e6.imag._M_elems[2].value = hStack_392.value;
          qStack_2e6.real.value = uStack_390;
          to_matrix3x3((matrix3d *)local_2c8,&qStack_2e6);
        }
        else {
          XformOp::get_value<tinyusdz::value::quatf>
                    ((optional<tinyusdz::value::quatf> *)&local_398,(XformOp *)local_1e8,t,tinterp);
          if (local_398 == (fmt)0x1) {
            dVar3 = (double)(float)CONCAT22(hStack_392.value,hStack_394.value);
            dVar4 = (double)(float)(CONCAT26(uStack_38e,
                                             CONCAT24(uStack_390,
                                                      CONCAT22(hStack_392.value,hStack_394.value)))
                                   >> 0x20);
            dVar33 = (double)fStack_38c;
            aStack_388._8_8_ = (undefined8)(float)aStack_388._M_allocated_capacity._0_4_;
            local_398 = SUB81(dVar3,0);
            uStack_397 = (undefined1)((ulong)dVar3 >> 8);
            hStack_396.value = (uint16_t)((ulong)dVar3 >> 0x10);
            hStack_394.value = (uint16_t)((ulong)dVar3 >> 0x20);
            hStack_392.value = (uint16_t)((ulong)dVar3 >> 0x30);
            uStack_390 = SUB82(dVar4,0);
            uStack_38e = (uint16_t)((ulong)dVar4 >> 0x10);
            fStack_38c = (float)(int)((ulong)dVar4 >> 0x20);
            aStack_388._M_allocated_capacity = (size_type)dVar33;
            linalg::qmat<double>((vec<double,_4> *)&local_398);
          }
          else {
            XformOp::get_value<tinyusdz::value::quatd>
                      ((optional<tinyusdz::value::quatd> *)&local_398,(XformOp *)local_1e8,t,tinterp
                      );
            if (local_398 == (fmt)0x0) {
              if (err != (string *)0x0) {
                if (local_1e0._M_string_length == 0) goto LAB_00238a38;
                local_238._0_3_ = SUB83(local_238 + 0x10,0);
                local_238._3_5_ = (undefined5)((ulong)(local_238 + 0x10) >> 0x18);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_238,
                           "`xformOp:orient:{}` is not quath, quatf or quatd type.\n","");
                fmt::format<std::__cxx11::string>
                          ((string *)&local_398,(fmt *)local_238,(string *)(local_1e8 + 8),pbVar15);
                std::__cxx11::string::_M_append
                          ((char *)err,
                           CONCAT26(hStack_392.value,
                                    CONCAT24(hStack_394.value,
                                             CONCAT22(hStack_396.value,
                                                      CONCAT11(uStack_397,local_398)))));
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT26(hStack_392.value,
                                      CONCAT24(hStack_394.value,
                                               CONCAT22(hStack_396.value,
                                                        CONCAT11(uStack_397,local_398))));
                if (paVar14 != &aStack_388) {
                  operator_delete(paVar14,CONCAT44(aStack_388._M_allocated_capacity._4_4_,
                                                   aStack_388._M_allocated_capacity._0_4_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT53(local_238._3_5_,local_238._0_3_) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_238 + 0x10)) {
                  uVar22 = CONCAT53(local_238._19_5_,CONCAT21(local_238._17_2_,local_238[0x10]));
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT53(local_238._3_5_,local_238._0_3_);
                  goto LAB_00238845;
                }
              }
              goto LAB_00238a3d;
            }
            local_238._0_3_ = (undefined3)CONCAT22(uStack_38e,uStack_390);
            local_238._3_5_ =
                 (undefined5)(CONCAT44(fStack_38c,CONCAT22(uStack_38e,uStack_390)) >> 0x18);
            local_238._8_3_ = (undefined3)aStack_388._M_allocated_capacity._0_4_;
            local_238._11_5_ =
                 (undefined5)
                 (CONCAT44(aStack_388._M_allocated_capacity._4_4_,
                           aStack_388._M_allocated_capacity._0_4_) >> 0x18);
            local_238[0x10] = (undefined1)aStack_388._8_4_;
            local_238._17_2_ = (undefined2)((uint)aStack_388._8_4_ >> 8);
            local_238._19_5_ = (undefined5)(CONCAT44(aStack_388._12_4_,aStack_388._8_4_) >> 0x18);
            local_238._24_3_ = (undefined3)uStack_378;
            local_238._27_5_ = (undefined5)(CONCAT44(uStack_374,uStack_378) >> 0x18);
            linalg::qmat<double>((vec<double,_4> *)local_238);
            pXVar23 = (XformEvaluator *)&local_398;
            puVar19 = (undefined8 *)local_2c8;
            for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar19 = (pXVar23->err)._M_dataplus._M_p;
              pXVar23 = (XformEvaluator *)((long)pXVar23 + (ulong)bVar29 * -0x10 + 8);
              puVar19 = puVar19 + (ulong)bVar29 * -2 + 1;
            }
          }
        }
        paVar14 = &aStack_388;
        if ((bool)local_1e8[4] == true) {
          local_398 = (fmt)0x0;
          uStack_397 = 0;
          hStack_396.value = 0;
          hStack_394.value = 0;
          hStack_392.value = 0x3ff0;
          aStack_388._8_4_ = 0;
          aStack_388._12_4_ = 0;
          uStack_390 = 0;
          uStack_38e = 0;
          fStack_38c = 0.0;
          aStack_388._M_allocated_capacity._0_4_ = 0;
          aStack_388._M_allocated_capacity._4_4_ = 0;
          uStack_378 = 0;
          uStack_374 = 0x3ff00000;
          local_360 = 0;
          uStack_35c = 0;
          local_370 = 0;
          uStack_36c = 0;
          uStack_368 = 0;
          uStack_364 = 0;
          uStack_358 = 0;
          uStack_354 = 0x3ff00000;
          bVar10 = inverse((matrix3d *)local_2c8,(matrix3d *)&local_398,0.0);
          if ((err != (string *)0x0) && (!bVar10)) {
            if (local_1e0._M_string_length == 0) {
              std::__cxx11::string::append((char *)err);
            }
            else {
              local_2e8 = SUB81(&local_2d8,0);
              uStack_2e7 = (undefined1)((ulong)&local_2d8 >> 8);
              qStack_2e6.imag._M_elems = SUB86((ulong)&local_2d8 >> 0x10,0);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2e8,
                         "`xformOp:orient:{}` is singular and cannot be inverted.\n","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_238,&local_2e8,(string *)(local_1e8 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar14);
              std::__cxx11::string::_M_append((char *)err,CONCAT53(local_238._3_5_,local_238._0_3_))
              ;
              if ((undefined1 *)CONCAT53(local_238._3_5_,local_238._0_3_) != local_238 + 0x10) {
                operator_delete((undefined1 *)CONCAT53(local_238._3_5_,local_238._0_3_),
                                CONCAT53(local_238._19_5_,CONCAT21(local_238._17_2_,local_238[0x10])
                                        ) + 1);
              }
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT62(qStack_2e6.imag._M_elems,CONCAT11(uStack_2e7,local_2e8));
              if (paVar14 != &local_2d8) {
                operator_delete(paVar14,(ulong)(local_2d8._M_allocated_capacity + 1));
              }
            }
          }
          pXVar23 = (XformEvaluator *)&local_398;
          puVar19 = (undefined8 *)local_2c8;
          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar19 = (pXVar23->err)._M_dataplus._M_p;
            pXVar23 = (XformEvaluator *)((long)pXVar23 + (ulong)bVar29 * -0x10 + 8);
            puVar19 = puVar19 + (ulong)bVar29 * -2 + 1;
          }
        }
        auStack_348 = ZEXT816(0);
        local_360 = 0;
        uStack_35c = 0;
        aStack_388._8_4_ = 0;
        aStack_388._12_4_ = 0;
        auStack_328 = ZEXT816(0);
        lVar11 = 0;
        do {
          *(undefined8 *)(&local_398 + lVar11) = 0x3ff0000000000000;
          lVar11 = lVar11 + 0x28;
        } while (lVar11 != 0xa0);
        local_398 = SUB81(local_2c8._0_8_,0);
        uStack_397 = SUB81(local_2c8._0_8_,1);
        hStack_396.value = SUB82(local_2c8._0_8_,2);
        hStack_394.value = SUB82(local_2c8._0_8_,4);
        hStack_392.value = SUB82(local_2c8._0_8_,6);
        uStack_390 = local_2c8._8_2_;
        uStack_38e = local_2c8._10_2_;
        fStack_38c = local_2c8._12_4_;
        aStack_388._M_allocated_capacity._0_4_ = local_2c8._16_4_;
        aStack_388._M_allocated_capacity._4_4_ = local_2c8._20_4_;
        uStack_378 = (undefined4)aaStack_2b8[0]._8_8_;
        uStack_374 = (undefined4)((ulong)aaStack_2b8[0]._8_8_ >> 0x20);
        local_370 = (undefined4)aaStack_2b8[1]._M_allocated_capacity;
        uStack_36c = (undefined4)((ulong)aaStack_2b8[1]._0_8_ >> 0x20);
        uStack_368 = aaStack_2b8[1]._8_4_;
        uStack_364 = aaStack_2b8[1]._12_4_;
        uStack_358 = aaStack_2b8[2]._0_4_;
        uStack_354 = aaStack_2b8[2]._4_4_;
        local_350 = (double)aaStack_2b8[2]._8_8_;
        auStack_348._0_8_ = aaStack_2b8[3]._0_8_;
        auStack_338 = ZEXT816(0);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = auStack_328._8_8_;
        auStack_328 = auVar44 << 0x40;
        lVar11 = 0x10;
        pXVar23 = (XformEvaluator *)&local_398;
LAB_002389f5:
        for (; lVar11 != 0; lVar11 = lVar11 + -1) {
          *(pointer *)pvVar26 = (pXVar23->err)._M_dataplus._M_p;
          pXVar23 = (XformEvaluator *)((long)pXVar23 + (ulong)bVar29 * -0x10 + 8);
          pvVar26 = pvVar26 + (ulong)bVar29 * -0x10 + 8;
        }
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        break;
      case 0xd:
        if (local_168 == 0) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)args;
          if (local_178 != (bool *)0x0) {
            *local_178 = true;
          }
          break;
        }
        if (err == (string *)0x0) goto LAB_00238a3d;
LAB_00238a38:
        std::__cxx11::string::append((char *)err);
        goto LAB_00238a3d;
      }
      tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
                ((matrix4d *)&local_398,(value *)local_138,&local_b8,(matrix4d *)paVar14);
      pXVar23 = (XformEvaluator *)&local_398;
      pmVar24 = &local_b8;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        pmVar24->m[0][0] = (double)(pXVar23->err)._M_dataplus._M_p;
        pXVar23 = (XformEvaluator *)((long)pXVar23 + (ulong)bVar29 * -0x10 + 8);
        pmVar24 = (matrix4d *)((long)pmVar24 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      bVar10 = true;
LAB_00238a40:
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)(local_1e8 + 0x48));
      if (local_1b0 != (vtable_type *)0x0) {
        (*local_1b0->destroy)((storage_union *)(local_1e8 + 0x28));
        local_1b0 = (vtable_type *)0x0;
      }
      if (local_1e0._M_dataplus._M_p != local_1e8 + 0x18) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10) {
        return false;
      }
      uVar17 = local_168 + 1;
      pXVar28 = (local_170->xformOps).
                super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
                super__Vector_impl_data._M_start;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x6db6db6db6db6db7;
    } while (uVar17 < (ulong)(((long)(local_170->xformOps).
                                     super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pXVar28 >> 4
                              ) * 0x6db6db6db6db6db7));
  }
  pmVar24 = &local_b8;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    local_140->m[0][0] = pmVar24->m[0][0];
    pmVar24 = (matrix4d *)((long)pmVar24 + ((ulong)bVar29 * -2 + 1) * 8);
    local_140 = (matrix4d *)((long)local_140 + ((ulong)bVar29 * -2 + 1) * 8);
  }
  return true;
}

Assistant:

bool Xformable::EvaluateXformOps(double t,
                                 value::TimeSampleInterpolationType tinterp,
                                 value::matrix4d *out_matrix,
                                 bool *resetXformStack,
                                 std::string *err) const {
  const auto RotateABC =
      [t, tinterp](const XformOp &x) -> nonstd::expected<value::matrix4d, std::string> {
    value::double3 v;
    if (auto h = x.get_value<value::half3>(t, tinterp)) {
      v[0] = double(half_to_float(h.value()[0]));
      v[1] = double(half_to_float(h.value()[1]));
      v[2] = double(half_to_float(h.value()[2]));
    } else if (auto f = x.get_value<value::float3>(t, tinterp)) {
      v[0] = double(f.value()[0]);
      v[1] = double(f.value()[1]);
      v[2] = double(f.value()[2]);
    } else if (auto d = x.get_value<value::double3>(t, tinterp)) {
      v = d.value();
    } else {
      if (x.suffix.empty()) {
        return nonstd::make_unexpected(
            fmt::format("`{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type)));
      } else {
        return nonstd::make_unexpected(
            fmt::format("`{}:{}` is not half3, float3 or double3 type.\n",
                        to_string(x.op_type), x.suffix));
      }
    }

    // invert input, and compute concatenated matrix
    // inv(ABC) = inv(A) x inv(B) x inv(C)
    // as done in pxrUSD.

    if (x.inverted) {
      v[0] = -v[0];
      v[1] = -v[1];
      v[2] = -v[2];
    }

    double xAngle = v[0];
    double yAngle = v[1];
    double zAngle = v[2];

    XformEvaluator eval;

    DCOUT("angles = " << xAngle << ", " << yAngle << ", " << zAngle);
    if (x.inverted) {
      DCOUT("!inverted!\n");
      if (x.op_type == XformOp::OpType::RotateXYZ) {
        // TODO: Apply defined switch for all Rotate*** op.
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    } else {
      if (x.op_type == XformOp::OpType::RotateXYZ) {

#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateXZY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYXZ) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
        eval.RotateZ(zAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateYZX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateY(yAngle);
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZYX) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateY(yAngle);
        eval.RotateX(xAngle);
#endif
      } else if (x.op_type == XformOp::OpType::RotateZXY) {
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        eval.Rotation({0.0, 0.0, 1.0}, zAngle);
        eval.Rotation({1.0, 0.0, 0.0}, xAngle);
        eval.Rotation({0.0, 1.0, 0.0}, yAngle);
#else
        eval.RotateZ(zAngle);
        eval.RotateX(xAngle);
        eval.RotateY(yAngle);
#endif
      } else {
        /// ???
        return nonstd::make_unexpected("[InternalError] RotateABC");
      }
    }

    return eval.result();
  };

  // Concat matrices
  //
  // Matrix concatenation ordering is its appearance order(right to left)
  // This is same with a notation in math equation: i.e,
  //
  // xformOpOrder = [A, B, C]
  //
  // M = A x B x C
  //
  // p' = A x B x C x p
  //
  // in post-multiply order.
  //
  // But in pre-multiply order system(pxrUSD and TinyUSDZ),
  // C++ code is
  //
  // p' = p x C x B x A
  //
  //
  value::matrix4d cm;
  Identity(&cm);

  for (size_t i = 0; i < xformOps.size(); i++) {
    const auto x = xformOps[i];

    value::matrix4d m;  // local matrix
    Identity(&m);

    switch (x.op_type) {
      case XformOp::OpType::ResetXformStack: {
        if (i != 0) {
          if (err) {
            (*err) +=
                "!resetXformStack! should only appear at the first element of "
                "xformOps\n";
          }
          return false;
        }

        // Notify resetting previous(parent node's) matrices
        if (resetXformStack) {
          (*resetXformStack) = true;
        }
        break;
      }
      case XformOp::OpType::Transform: {
        if (auto sxf = x.get_value<value::matrix4f>(t, tinterp)) {
          value::matrix4f mf = sxf.value();
          for (size_t j = 0; j < 4; j++) {
            for (size_t k = 0; k < 4; k++) {
              m.m[j][k] = double(mf.m[j][k]);
            }
          }
        } else if (auto sxd = x.get_value<value::matrix4d>(t, tinterp)) {
          m = sxd.value();
        } else {
          if (err) {
            (*err) += "`xformOp:transform` is not matrix4f or matrix4d type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // Singular check.
          // pxrUSD uses 1e-9
          double det = determinant(m);

          if (std::fabs(det) < 1e-9) {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:transform` is singular matrix and cannot be "
                    "inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:transform:{}` is singular matrix and cannot be "
                    "inverted.\n",
                    x.suffix);
              }
            }

            return false;
          }

          m = inverse(m);
        }

        break;
      }
      case XformOp::OpType::Scale: {
        double sx, sy, sz;

        if (auto sxh = x.get_value<value::half3>(t, tinterp)) {
          sx = double(half_to_float(sxh.value()[0]));
          sy = double(half_to_float(sxh.value()[1]));
          sz = double(half_to_float(sxh.value()[2]));
        } else if (auto sxf = x.get_value<value::float3>(t, tinterp)) {
          sx = double(sxf.value()[0]);
          sy = double(sxf.value()[1]);
          sz = double(sxf.value()[2]);
        } else if (auto sxd = x.get_value<value::double3>(t, tinterp)) {
          sx = sxd.value()[0];
          sy = sxd.value()[1];
          sz = sxd.value()[2];
        } else {
          if (err) {
            (*err) += "`xformOp:scale` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          // FIXME: Safe division
          sx = 1.0 / sx;
          sy = 1.0 / sy;
          sz = 1.0 / sz;
        }

        m.m[0][0] = sx;
        m.m[1][1] = sy;
        m.m[2][2] = sz;

        break;
      }
      case XformOp::OpType::Translate: {
        double tx, ty, tz;
        if (auto txh = x.get_value<value::half3>(t, tinterp)) {
          tx = double(half_to_float(txh.value()[0]));
          ty = double(half_to_float(txh.value()[1]));
          tz = double(half_to_float(txh.value()[2]));
        } else if (auto txf = x.get_value<value::float3>(t, tinterp)) {
          tx = double(txf.value()[0]);
          ty = double(txf.value()[1]);
          tz = double(txf.value()[2]);
        } else if (auto txd = x.get_value<value::double3>(t, tinterp)) {
          tx = txd.value()[0];
          ty = txd.value()[1];
          tz = txd.value()[2];
        } else {
          if (err) {
            (*err) +=
                "`xformOp:translate` is not half3, float3 or double3 type.\n";
          }
          return false;
        }

        if (x.inverted) {
          tx = -tx;
          ty = -ty;
          tz = -tz;
        }

        m.m[3][0] = tx;
        m.m[3][1] = ty;
        m.m[3][2] = tz;

        break;
      }
      // FIXME: Validate ROTATE_X, _Y, _Z implementation
      case XformOp::OpType::RotateX: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateX` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateX:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({1.0, 0.0, 0.0}, angle);
#else
        xe.RotateX(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateY: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateY` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateY:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 1.0, 0.0}, angle);
#else
        xe.RotateY(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::RotateZ: {
        double angle;  // in degrees
        if (auto h = x.get_value<value::half>(t, tinterp)) {
          angle = double(half_to_float(h.value()));
        } else if (auto f = x.get_value<float>(t, tinterp)) {
          angle = double(f.value());
        } else if (auto d = x.get_value<double>(t, tinterp)) {
          angle = d.value();
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) +=
                  "`xformOp:rotateZ` is not half, float or double type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:rotateZ:{}` is not half, float or double type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        XformEvaluator xe;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
        xe.Rotation({0.0, 0.0, 1.0}, angle);
#else
        xe.RotateZ(angle);
#endif
        auto ret = xe.result();

        if (ret) {
          m = ret.value();
        } else {
          if (err) {
            (*err) += ret.error();
          }
          return false;
        }
        break;
      }
      case XformOp::OpType::Orient: {
        // value::quat stores elements in (x, y, z, w)
        // linalg::quat also stores elements in (x, y, z, w)

        value::matrix3d rm;
        if (auto h = x.get_value<value::quath>(t, tinterp)) {
          rm = to_matrix3x3(h.value());
        } else if (auto f = x.get_value<value::quatf>(t, tinterp)) {
          rm = to_matrix3x3(f.value());
        } else if (auto d = x.get_value<value::quatd>(t, tinterp)) {
          rm = to_matrix3x3(d.value());
        } else {
          if (err) {
            if (x.suffix.empty()) {
              (*err) += "`xformOp:orient` is not quath, quatf or quatd type.\n";
            } else {
              (*err) += fmt::format(
                  "`xformOp:orient:{}` is not quath, quatf or quatd type.\n",
                  x.suffix);
            }
          }
          return false;
        }

        // FIXME: invert before getting matrix.
        if (x.inverted) {
          value::matrix3d inv_rm;
          if (inverse(rm, inv_rm)) {
          } else {
            if (err) {
              if (x.suffix.empty()) {
                (*err) +=
                    "`xformOp:orient` is singular and cannot be inverted.\n";
              } else {
                (*err) += fmt::format(
                    "`xformOp:orient:{}` is singular and cannot be inverted.\n",
                    x.suffix);
              }
            }
          }

          rm = inv_rm;
        }

        m = to_matrix(rm, {0.0, 0.0, 0.0});

        break;
      }

      case XformOp::OpType::RotateXYZ:
      case XformOp::OpType::RotateXZY:
      case XformOp::OpType::RotateYXZ:
      case XformOp::OpType::RotateYZX:
      case XformOp::OpType::RotateZXY:
      case XformOp::OpType::RotateZYX: {
        auto ret = RotateABC(x);

        if (!ret) {
          (*err) += ret.error();
          return false;
        }

        m = ret.value();
      }
    }

    cm = m * cm;  // `m` fist for pre-multiply system.
  }

  (*out_matrix) = cm;

  return true;
}